

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_time.cpp
# Opt level: O0

MppStopwatch mpp_stopwatch_get(char *name)

{
  void *ptr;
  MppStopwatchNode *nodes;
  MppStopwatchImpl *impl;
  char *name_local;
  
  nodes = (MppStopwatchNode *)mpp_osal_calloc("mpp_stopwatch_get",0x68);
  ptr = mpp_osal_calloc("mpp_stopwatch_get",0x240);
  if ((nodes == (MppStopwatchNode *)0x0) || (ptr == (void *)0x0)) {
    _mpp_log_l(2,"mpp_time","malloc failed\n","mpp_stopwatch_get");
    if (nodes != (MppStopwatchNode *)0x0) {
      mpp_osal_free("mpp_stopwatch_get",nodes);
    }
    nodes = (MppStopwatchNode *)0x0;
    if (ptr != (void *)0x0) {
      mpp_osal_free("mpp_stopwatch_get",ptr);
    }
  }
  else {
    *(char **)nodes->event = stopwatch_name;
    snprintf(nodes->event + 8,0x3f,name,0);
    *(void **)(nodes[1].event + 0x18) = ptr;
    nodes[1].event[0] = '\b';
    nodes[1].event[1] = '\0';
    nodes[1].event[2] = '\0';
    nodes[1].event[3] = '\0';
  }
  return nodes;
}

Assistant:

MppStopwatch mpp_stopwatch_get(const char *name)
{
    MppStopwatchImpl *impl = mpp_calloc(MppStopwatchImpl, 1);
    MppStopwatchNode *nodes = mpp_calloc(MppStopwatchNode, 8);

    if (impl && nodes) {
        impl->check = stopwatch_name;
        snprintf(impl->name, sizeof(impl->name) - 1, name, NULL);
        impl->nodes = nodes;
        impl->max_count = 8;
    } else {
        mpp_err_f("malloc failed\n");
        MPP_FREE(impl);
        MPP_FREE(nodes);
    }

    return impl;
}